

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.hpp
# Opt level: O0

void Catch::setRngSeed(ConfigData *config,string *seed)

{
  bool bVar1;
  byte bVar2;
  time_t tVar3;
  runtime_error *this;
  string *in_RSI;
  long in_RDI;
  stringstream ss;
  char *in_stack_fffffffffffffe48;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffe50;
  stringstream local_198 [16];
  ostream local_188 [376];
  string *local_10;
  long local_8;
  
  local_10 = in_RSI;
  local_8 = in_RDI;
  bVar1 = std::operator==(in_stack_fffffffffffffe50,in_stack_fffffffffffffe48);
  if (bVar1) {
    tVar3 = time((time_t *)0x0);
    *(int *)(local_8 + 0x10) = (int)tVar3;
  }
  else {
    std::__cxx11::stringstream::stringstream(local_198);
    std::operator<<(local_188,local_10);
    std::istream::operator>>((istream *)local_198,(uint *)(local_8 + 0x10));
    bVar2 = std::ios::fail();
    if ((bVar2 & 1) != 0) {
      this = (runtime_error *)__cxa_allocate_exception(0x10);
      std::runtime_error::runtime_error
                (this,"Argment to --rng-seed should be the word \'time\' or a number");
      __cxa_throw(this,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
    }
    std::__cxx11::stringstream::~stringstream(local_198);
  }
  return;
}

Assistant:

inline void setRngSeed( ConfigData& config, std::string const& seed ) {
        if( seed == "time" ) {
            config.rngSeed = static_cast<unsigned int>( std::time(0) );
        }
        else {
            std::stringstream ss;
            ss << seed;
            ss >> config.rngSeed;
            if( ss.fail() )
                throw std::runtime_error( "Argment to --rng-seed should be the word 'time' or a number" );
        }
    }